

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

bool __thiscall Omega_h::CmdLine::parse_final(CmdLine *this,CommPtr *comm,int *p_argc,char **argv)

{
  bool bVar1;
  I32 IVar2;
  element_type *this_00;
  shared_ptr<Omega_h::Comm> local_48;
  undefined1 local_32;
  byte local_31;
  bool was_empty;
  char **ppcStack_30;
  bool no_error;
  char **argv_local;
  int *p_argc_local;
  CommPtr *comm_local;
  CmdLine *this_local;
  
  ppcStack_30 = argv;
  argv_local = (char **)p_argc;
  p_argc_local = (int *)comm;
  comm_local = (CommPtr *)this;
  this_00 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)comm);
  IVar2 = Comm::rank(this_00);
  local_31 = parse(this,p_argc,argv,IVar2 == 0);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_48,comm);
  bVar1 = check_empty(&local_48,*(int *)argv_local,ppcStack_30);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_48);
  if ((((local_31 & 1) == 0) || ((this->parsed_help_ & 1U) != 0)) || (!bVar1)) {
    local_32 = bVar1;
    show_help(this,ppcStack_30);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdLine::parse_final(CommPtr comm, int* p_argc, char** argv) {
  bool no_error = parse(p_argc, argv, !comm->rank());
  bool was_empty = check_empty(comm, *p_argc, argv);
  if (no_error && !parsed_help_ && was_empty) return true;
  show_help(argv);
  return false;
}